

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool flatbuffers::anon_unknown_0::CompareSerializedScalars(uint8_t *a,uint8_t *b,FieldDef *key)

{
  uint6 uVar1;
  uint uVar2;
  byte *pbVar3;
  float *pfVar4;
  uint8_t *puVar5;
  double *pdVar6;
  long *plVar7;
  int *piVar8;
  short *psVar9;
  ushort *puVar10;
  ulong *puVar11;
  uint *puVar12;
  bool bVar13;
  bool bVar14;
  float def;
  undefined8 local_20;
  
  uVar2 = local_20._4_4_;
  uVar1 = local_20._2_6_;
  switch((key->value).type.base_type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_BOOL:
  case BASE_TYPE_UCHAR:
    local_20 = (double)((ulong)local_20._1_7_ << 8);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<unsigned_char>((key->value).constant._M_dataplus._M_p,(uchar *)&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    pbVar3 = (byte *)&local_20;
    if (b != (uint8_t *)0x0) {
      pbVar3 = b;
    }
    bVar13 = *a < *pbVar3;
    break;
  case BASE_TYPE_CHAR:
    local_20 = (double)((ulong)local_20._1_7_ << 8);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<signed_char>((key->value).constant._M_dataplus._M_p,(char *)&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    puVar5 = (uint8_t *)&local_20;
    if (b != (uint8_t *)0x0) {
      puVar5 = b;
    }
    bVar14 = SBORROW1(*a,*puVar5);
    bVar13 = (char)(*a - *puVar5) < '\0';
    goto LAB_0011a065;
  case BASE_TYPE_SHORT:
    local_20 = (double)((ulong)uVar1 << 0x10);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<short>((key->value).constant._M_dataplus._M_p,(short *)&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    psVar9 = (short *)&local_20;
    if (b != (uint8_t *)0x0) {
      psVar9 = (short *)b;
    }
    bVar14 = SBORROW2(*(short *)a,*psVar9);
    bVar13 = (short)(*(short *)a - *psVar9) < 0;
    goto LAB_0011a065;
  case BASE_TYPE_USHORT:
    local_20 = (double)((ulong)uVar1 << 0x10);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<unsigned_short>
                ((key->value).constant._M_dataplus._M_p,(unsigned_short *)&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    puVar10 = (ushort *)&local_20;
    if (b != (uint8_t *)0x0) {
      puVar10 = (ushort *)b;
    }
    bVar13 = *(ushort *)a < *puVar10;
    break;
  case BASE_TYPE_INT:
    local_20 = (double)((ulong)uVar2 << 0x20);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<int>((key->value).constant._M_dataplus._M_p,(int *)&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    piVar8 = (int *)&local_20;
    if (b != (uint8_t *)0x0) {
      piVar8 = (int *)b;
    }
    bVar14 = SBORROW4(*(int *)a,*piVar8);
    bVar13 = *(int *)a - *piVar8 < 0;
    goto LAB_0011a065;
  case BASE_TYPE_UINT:
    local_20 = (double)((ulong)uVar2 << 0x20);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<unsigned_int>((key->value).constant._M_dataplus._M_p,(uint *)&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    puVar12 = (uint *)&local_20;
    if (b != (uint8_t *)0x0) {
      puVar12 = (uint *)b;
    }
    bVar13 = *(uint *)a < *puVar12;
    break;
  case BASE_TYPE_LONG:
    local_20 = 0.0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<long>((key->value).constant._M_dataplus._M_p,&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    plVar7 = &local_20;
    if (b != (uint8_t *)0x0) {
      plVar7 = (long *)b;
    }
    bVar14 = SBORROW8(*(long *)a,*plVar7);
    bVar13 = *(long *)a - *plVar7 < 0;
LAB_0011a065:
    bVar13 = bVar14 != bVar13;
    break;
  case BASE_TYPE_ULONG:
    local_20 = 0.0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToNumber<unsigned_long>((key->value).constant._M_dataplus._M_p,&local_20);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    puVar11 = &local_20;
    if (b != (uint8_t *)0x0) {
      puVar11 = (ulong *)b;
    }
    bVar13 = *(ulong *)a < *puVar11;
    break;
  case BASE_TYPE_FLOAT:
    local_20 = (double)((ulong)uVar2 << 0x20);
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToFloatImpl<float>((float *)&local_20,(key->value).constant._M_dataplus._M_p);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    pfVar4 = (float *)&local_20;
    if (b != (uint8_t *)0x0) {
      pfVar4 = (float *)b;
    }
    bVar13 = *pfVar4 == *(float *)a;
    bVar14 = *pfVar4 < *(float *)a;
    goto LAB_00119f90;
  case BASE_TYPE_DOUBLE:
    local_20 = 0.0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToFloatImpl<double>((double *)&local_20,(key->value).constant._M_dataplus._M_p);
      if (a == (uint8_t *)0x0) {
        a = (uint8_t *)&local_20;
      }
    }
    pdVar6 = (double *)&local_20;
    if (b != (uint8_t *)0x0) {
      pdVar6 = (double *)b;
    }
    bVar13 = *pdVar6 == *(double *)a;
    bVar14 = *pdVar6 < *(double *)a;
LAB_00119f90:
    bVar13 = !bVar14 && !bVar13;
    break;
  default:
    __assert_fail("false && \"scalar type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0xda,
                  "bool flatbuffers::(anonymous namespace)::CompareSerializedScalars(const uint8_t *, const uint8_t *, const FieldDef &)"
                 );
  }
  return bVar13;
}

Assistant:

static bool CompareSerializedScalars(const uint8_t *a, const uint8_t *b,
                                     const FieldDef &key) {
  switch (key.value.type.base_type) {
#define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...)                       \
  case BASE_TYPE_##ENUM: {                                              \
    CTYPE def = static_cast<CTYPE>(0);                                  \
    if (!a || !b) { StringToNumber(key.value.constant.c_str(), &def); } \
    const auto av = a ? ReadScalar<CTYPE>(a) : def;                     \
    const auto bv = b ? ReadScalar<CTYPE>(b) : def;                     \
    return av < bv;                                                     \
  }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
#undef FLATBUFFERS_TD
    default: {
      FLATBUFFERS_ASSERT(false && "scalar type expected");
      return false;
    }
  }
}